

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O3

QMimeData * __thiscall QUrlModel::mimeData(QUrlModel *this,QModelIndexList *indexes)

{
  QAbstractItemModel *pQVar1;
  QMimeData *this_00;
  QModelIndex *index;
  QModelIndex *pQVar2;
  long lVar3;
  long in_FS_OFFSET;
  QUrl local_80;
  QArrayDataPointer<QUrl> local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.d = (Data *)0x0;
  local_78.ptr = (QUrl *)0x0;
  local_78.size = 0;
  lVar3 = (indexes->d).size;
  if (lVar3 != 0) {
    pQVar2 = (indexes->d).ptr;
    lVar3 = lVar3 * 0x18;
    do {
      if (pQVar2->c == 0) {
        pQVar1 = (pQVar2->m).ptr;
        if (pQVar1 == (QAbstractItemModel *)0x0) {
          local_58.shared = (PrivateShared *)0x0;
          local_58._8_8_ = 0;
          local_58._16_8_ = 0;
          local_40 = 2;
        }
        else {
          (**(code **)(*(long *)pQVar1 + 0x90))(&local_58,pQVar1,pQVar2,0x101);
        }
        ::QVariant::toUrl();
        QtPrivate::QMovableArrayOps<QUrl>::emplace<QUrl>
                  ((QMovableArrayOps<QUrl> *)&local_78,local_78.size,&local_80);
        QList<QUrl>::end((QList<QUrl> *)&local_78);
        QUrl::~QUrl(&local_80);
        ::QVariant::~QVariant((QVariant *)&local_58);
      }
      pQVar2 = pQVar2 + 1;
      lVar3 = lVar3 + -0x18;
    } while (lVar3 != 0);
  }
  this_00 = (QMimeData *)operator_new(0x10);
  QMimeData::QMimeData(this_00);
  QMimeData::setUrls((QList_conflict *)this_00);
  QArrayDataPointer<QUrl>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QMimeData *QUrlModel::mimeData(const QModelIndexList &indexes) const
{
    QList<QUrl> list;
    for (const auto &index : indexes) {
        if (index.column() == 0)
           list.append(index.data(UrlRole).toUrl());
    }
    QMimeData *data = new QMimeData();
    data->setUrls(list);
    return data;
}